

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O0

ostream * avro::operator<<(ostream *os,indent x)

{
  int iVar1;
  int in_ESI;
  ostream *in_RDI;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  allocator<char> local_11;
  ostream *local_10;
  int local_4;
  
  local_10 = in_RDI;
  local_4 = in_ESI;
  if ((operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::allocator<char>::~allocator(&local_11);
    __cxa_atexit(std::__cxx11::string::~string,
                 &operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_);
  }
  while (local_4 != 0) {
    local_4 = local_4 + -1;
    std::operator<<(local_10,(string *)&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_);
  }
  return local_10;
}

Assistant:

std::ostream& operator <<(std::ostream &os, indent x)
{
    static const std::string spaces("    ");
    while(x.d--) {
        os << spaces; 
    }
    return os;
}